

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_constant_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,ConstantExpression *expr,
          idx_t depth)

{
  BoundConstantExpression *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  Value local_58;
  
  this_00 = (BoundConstantExpression *)operator_new(0x98);
  Value::Value(&local_58,&expr->value);
  BoundConstantExpression::BoundConstantExpression(this_00,&local_58);
  Value::~Value(&local_58);
  local_60._M_head_impl = (Expression *)this_00;
  BindResult::BindResult
            (__return_storage_ptr__,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_60);
  if ((BoundConstantExpression *)local_60._M_head_impl != (BoundConstantExpression *)0x0) {
    (*(((Expression *)&(local_60._M_head_impl)->super_BaseExpression)->super_BaseExpression).
      _vptr_BaseExpression[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(ConstantExpression &expr, idx_t depth) {
	return BindResult(make_uniq<BoundConstantExpression>(expr.value));
}